

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData *
GenerateRainbowArtsTrack
          (TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track,int weak_offset,
          int weak_size)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar1;
  TrackData *this;
  int iVar2;
  Data *data;
  Sector *pSVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  pointer pSVar4;
  pointer this_00;
  allocator_type local_145;
  int local_144;
  Track *local_140;
  long local_138;
  TrackData *local_130;
  size_t __len;
  CylHead *local_120;
  pointer local_118;
  Data data1;
  FluxTrackBuilder fluxbuf;
  BitstreamTrackBuilder bitbuf;
  
  local_144 = weak_size;
  local_140 = track;
  local_130 = __return_storage_ptr__;
  local_120 = cylhead;
  FluxTrackBuilder::FluxTrackBuilder(&fluxbuf,cylhead,_250K,MFM);
  TrackBuilder::addTrackStart(&fluxbuf.super_TrackBuilder,false);
  BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
  TrackBuilder::addTrackStart(&bitbuf.super_TrackBuilder,false);
  pSVar4 = (local_140->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_138 = (long)weak_offset;
  __len = (size_t)local_144;
  local_118 = pSVar4;
  for (this_00 = (local_140->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pSVar4; this_00 = this_00 + 1) {
    data = Sector::data_copy(this_00,0);
    pSVar3 = Track::operator[](local_140,1);
    if (this_00 == pSVar3) {
      TrackBuilder::addSectorUpToData(&fluxbuf.super_TrackBuilder,&this_00->header,this_00->dam);
      __first._M_current =
           (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data1,__first,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(__first._M_current + local_138),&local_145);
      TrackBuilder::addBlock(&fluxbuf.super_TrackBuilder,&data1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data1);
      FluxTrackBuilder::addWeakBlock(&fluxbuf,local_144);
      puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = Sector::size(this_00);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data1,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar1 + __len + local_138),
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar1 + iVar2),&local_145);
      TrackBuilder::addBlock(&fluxbuf.super_TrackBuilder,&data1);
      pSVar4 = local_118;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data1);
    }
    else {
      TrackBuilder::addSector
                (&fluxbuf.super_TrackBuilder,&this_00->header,data,0x54,this_00->dam,false);
    }
    TrackBuilder::addSector
              (&bitbuf.super_TrackBuilder,&this_00->header,data,0x2e,this_00->dam,this_00 == pSVar3)
    ;
    pSVar3 = Track::operator[](local_140,5);
    if (this_00 == pSVar3) {
      pSVar3 = Track::operator[](local_140,1);
      __x = &Sector::data_copy(pSVar3,0)->
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data1,__x);
      if (local_144 != 0) {
        memset(data1.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + local_138,0xee,__len);
      }
      TrackBuilder::addSector
                (&bitbuf.super_TrackBuilder,&pSVar3->header,&data1,0x2e,pSVar3->dam,true);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data1);
    }
  }
  TrackData::TrackData(local_130,local_120);
  this = local_130;
  bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
  TrackData::add(this,bitstream);
  BitBuffer::~BitBuffer(&bitbuf.m_buffer);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&fluxbuf.m_flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return this;
}

Assistant:

TrackData GenerateRainbowArtsTrack(const CylHead& cylhead, const Track& track, int weak_offset, int weak_size)
{
#ifdef _DEBUG
    int temp_offset, temp_size;
    assert(IsRainbowArtsTrack(track, temp_offset, temp_size));
    assert(weak_offset == temp_offset && weak_size == temp_size);
#endif

    FluxTrackBuilder fluxbuf(cylhead, DataRate::_250K, Encoding::MFM);
    fluxbuf.addTrackStart();

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    for (auto& sector : track)
    {
        auto& data_copy = sector.data_copy();
        auto is_weak{ &sector == &track[1] };

        if (!is_weak)
            fluxbuf.addSector(sector.header, data_copy, 0x54, sector.dam);
        else
        {
            fluxbuf.addSectorUpToData(sector.header, sector.dam);
            fluxbuf.addBlock(Data(data_copy.begin(), data_copy.begin() + weak_offset));
            fluxbuf.addWeakBlock(weak_size);
            fluxbuf.addBlock(Data(
                data_copy.begin() + weak_offset + weak_size,
                data_copy.begin() + sector.size()));
        }

        bitbuf.addSector(sector.header, data_copy, 0x2e, sector.dam, is_weak);

        // Add duplicate weak sector half way around track.
        if (&sector == &track[5])
        {
            // Add a duplicate of the weak sector, with different data from the weak position
            auto& sector1{ track[1] };
            auto data1{ sector1.data_copy() };
            std::fill(data1.begin() + weak_offset, data1.begin() + weak_offset + weak_size, uint8_t(0xee));
            bitbuf.addSector(sector1.header, data1, 0x2e, sector1.dam, true);
        }
    }

    TrackData trackdata(cylhead);
    trackdata.add(std::move(bitbuf.buffer()));
    //trackdata.add(FluxData({ fluxbuf.buffer() }));
    return trackdata;
}